

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_recv(int s,void *buf,size_t len,int flags)

{
  int iVar1;
  nn_msghdr hdr;
  nn_iovec iov;
  int in_stack_000000a4;
  nn_msghdr *in_stack_000000a8;
  int in_stack_000000b0;
  
  iVar1 = nn_recvmsg(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4);
  return iVar1;
}

Assistant:

int nn_recv (int s, void *buf, size_t len, int flags)
{
    struct nn_iovec iov;
    struct nn_msghdr hdr;

    iov.iov_base = buf;
    iov.iov_len = len;

    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    hdr.msg_control = NULL;
    hdr.msg_controllen = 0;

    return nn_recvmsg (s, &hdr, flags);
}